

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void PrefixAttacher(ostream *s,LogMessageInfo *l,void *data)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  void *data_local;
  LogMessageInfo *l_local;
  ostream *s_local;
  
  if ((data != (void *)0x0) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              data,"good data"), !bVar1)) {
    poVar5 = std::operator<<(s,*l->severity);
    _Var3 = std::setw(4);
    poVar5 = std::operator<<(poVar5,_Var3);
    iVar4 = google::LogMessageTime::year(l->time);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4 + 0x76c);
    _Var3 = std::setw(2);
    poVar5 = std::operator<<(poVar5,_Var3);
    iVar4 = google::LogMessageTime::month(l->time);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4 + 1);
    _Var3 = std::setw(2);
    poVar5 = std::operator<<(poVar5,_Var3);
    iVar4 = google::LogMessageTime::day(l->time);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,' ');
    _Var3 = std::setw(2);
    poVar5 = std::operator<<(poVar5,_Var3);
    iVar4 = google::LogMessageTime::hour(l->time);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,':');
    _Var3 = std::setw(2);
    poVar5 = std::operator<<(poVar5,_Var3);
    iVar4 = google::LogMessageTime::min(l->time);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,':');
    _Var3 = std::setw(2);
    poVar5 = std::operator<<(poVar5,_Var3);
    iVar4 = google::LogMessageTime::sec(l->time);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,".");
    _Var3 = std::setw(6);
    poVar5 = std::operator<<(poVar5,_Var3);
    lVar6 = google::LogMessageTime::usec(l->time);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar6);
    poVar5 = std::operator<<(poVar5,' ');
    _Var2 = std::setfill<char>(' ');
    poVar5 = std::operator<<(poVar5,_Var2._M_c);
    _Var3 = std::setw(5);
    poVar5 = std::operator<<(poVar5,_Var3);
    pbVar7 = std::operator<<(poVar5,(id)(l->thread_id)._M_thread);
    _Var2 = std::setfill<char>('0');
    poVar5 = std::operator<<(pbVar7,_Var2._M_c);
    poVar5 = std::operator<<(poVar5,' ');
    poVar5 = std::operator<<(poVar5,l->filename);
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*l->line_number);
    std::operator<<(poVar5,"]");
  }
  return;
}

Assistant:

void PrefixAttacher(std::ostream& s, const LogMessageInfo& l, void* data) {
  // Assert that `data` contains the expected contents before producing the
  // prefix (otherwise causing the tests to fail):
  if (data == nullptr || *static_cast<string*>(data) != "good data") {
    return;
  }

  s << l.severity[0] << setw(4) << 1900 + l.time.year() << setw(2)
    << 1 + l.time.month() << setw(2) << l.time.day() << ' ' << setw(2)
    << l.time.hour() << ':' << setw(2) << l.time.min() << ':' << setw(2)
    << l.time.sec() << "." << setw(6) << l.time.usec() << ' ' << setfill(' ')
    << setw(5) << l.thread_id << setfill('0') << ' ' << l.filename << ':'
    << l.line_number << "]";
}